

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

bool __thiscall
capnp::compiler::NodeTranslator::compileType
          (NodeTranslator *this,Reader source,Builder target,ImplicitParams implicitMethodParams)

{
  NullableValue<capnp::compiler::BrandedDecl> *other;
  BrandedDecl *pBVar1;
  BrandedDecl *decl;
  Maybe<capnp::compiler::BrandedDecl> local_178;
  undefined1 local_c8 [8];
  NullableValue<capnp::compiler::BrandedDecl> _decl1763;
  NodeTranslator *this_local;
  
  _decl1763.field_1._160_8_ = this;
  compileDeclExpression(&local_178,this,source,implicitMethodParams);
  other = kj::_::readMaybe<capnp::compiler::BrandedDecl>(&local_178);
  kj::_::NullableValue<capnp::compiler::BrandedDecl>::NullableValue
            ((NullableValue<capnp::compiler::BrandedDecl> *)local_c8,other);
  kj::Maybe<capnp::compiler::BrandedDecl>::~Maybe(&local_178);
  pBVar1 = kj::_::NullableValue::operator_cast_to_BrandedDecl_((NullableValue *)local_c8);
  if (pBVar1 == (BrandedDecl *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    pBVar1 = kj::_::NullableValue<capnp::compiler::BrandedDecl>::operator*
                       ((NullableValue<capnp::compiler::BrandedDecl> *)local_c8);
    this_local._7_1_ = BrandedDecl::compileAsType(pBVar1,this->errorReporter,target);
  }
  kj::_::NullableValue<capnp::compiler::BrandedDecl>::~NullableValue
            ((NullableValue<capnp::compiler::BrandedDecl> *)local_c8);
  return this_local._7_1_;
}

Assistant:

bool NodeTranslator::compileType(Expression::Reader source, schema::Type::Builder target,
                                 ImplicitParams implicitMethodParams) {
  KJ_IF_SOME(decl, compileDeclExpression(source, implicitMethodParams)) {
    return decl.compileAsType(errorReporter, target);
  } else {
    return false;
  }
}